

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O2

void __thiscall AwsCommandRunner::SyncDirectory(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *this_00;
  _Base_ptr p_Var1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator local_fd;
  allocator_type local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator_type local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sync_command;
  string full_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  GetFullUrl(&full_url,this,path);
  this_00 = this->command_runner_;
  std::__cxx11::string::string((string *)&local_b0,"aws",&local_fd);
  std::__cxx11::string::string(local_90,"s3",&local_fa);
  std::__cxx11::string::string(local_70,"rm",&local_fb);
  std::__cxx11::string::string(local_50,(string *)&full_url);
  __l._M_len = 4;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sync_command,__l,&local_fc);
  MultipleCommandRunner::RunCommand(this_00,&sync_command,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sync_command);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string((string *)&local_b0,"aws",&local_fd);
  std::__cxx11::string::string(local_90,"s3",&local_fa);
  std::__cxx11::string::string(local_70,"sync",&local_fb);
  std::__cxx11::string::string(local_50,"--delete",(allocator *)&local_fc);
  __l_00._M_len = 4;
  __l_00._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sync_command,__l_00,&local_f9);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  for (p_Var1 = (this->sync_excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->sync_excludes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::string((string *)&local_b0,"--exclude",&local_fd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sync_command,
               &local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&sync_command,(value_type *)(p_Var1 + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&sync_command,path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&sync_command,&full_url);
  MultipleCommandRunner::RunCommand(this->command_runner_,&sync_command,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sync_command);
  std::__cxx11::string::~string((string *)&full_url);
  return;
}

Assistant:

void AwsCommandRunner::SyncDirectory(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", full_url}, true);

  // Append files that we want to exclude in the form of "--exclude" options.
  std::vector<std::string> sync_command{{"aws", "s3", "sync", "--delete"}};
  for (const std::string& sync_exclude : sync_excludes_) {
    sync_command.push_back("--exclude");
    sync_command.push_back(sync_exclude);
  }
  sync_command.push_back(path);
  sync_command.push_back(full_url);
  command_runner_->RunCommand(sync_command, false);
}